

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmath.c
# Opt level: O2

void xvm_sub(double *r,double *x,double *y,uint64_t N)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint64_t n;
  
  for (n = 0; n < N; n = n + 4) {
    dVar1 = (x + n)[1];
    dVar2 = x[n + 2];
    dVar3 = (x + n + 2)[1];
    dVar4 = (y + n)[1];
    dVar5 = y[n + 2];
    dVar6 = (y + n + 2)[1];
    r[n] = x[n] - y[n];
    (r + n)[1] = dVar1 - dVar4;
    r[n + 2] = dVar2 - dVar5;
    (r + n + 2)[1] = dVar3 - dVar6;
  }
  return;
}

Assistant:

void xvm_sub(double r[], const double x[], const double y[], uint64_t N) {
#if defined(__SSE2__) && !defined(XVM_ANSI)
	assert(r != NULL && ((uintptr_t)r % 16) == 0);
	assert(x != NULL && ((uintptr_t)x % 16) == 0);
	assert(y != NULL && ((uintptr_t)y % 16) == 0);
	for (uint64_t n = 0; n < N; n += 4) {
		const __m128d x0 = _mm_load_pd(x + n    );
		const __m128d x1 = _mm_load_pd(x + n + 2);
		const __m128d y0 = _mm_load_pd(y + n    );
		const __m128d y1 = _mm_load_pd(y + n + 2);
		const __m128d r0 = _mm_sub_pd(x0, y0);
		const __m128d r1 = _mm_sub_pd(x1, y1);
		_mm_store_pd(r + n,     r0);
		_mm_store_pd(r + n + 2, r1);
	}
#else
	for (uint64_t n = 0; n < N; n++)
		r[n] = x[n] - y[n];
#endif
}